

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O0

void __thiscall Logger::Logger(Logger *this,char *fileName,int line)

{
  char *in_stack_00000018;
  Impl *in_stack_00000020;
  
  Impl::Impl(in_stack_00000020,in_stack_00000018,this._4_4_);
  return;
}

Assistant:

Logger::Logger(const char* fileName, int line)
        :impl_(fileName, line){ }